

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O0

void __thiscall OpenMD::Perturbations::Light::Light(Light *this,SimInfo *info)

{
  Globals *this_00;
  LightParameters *pLVar1;
  SimInfo *in_RSI;
  ForceModifier *in_RDI;
  
  ForceModifier::ForceModifier(in_RDI,in_RSI);
  in_RDI->_vptr_ForceModifier = (_func_int **)&PTR__Light_00500d58;
  *(undefined1 *)&in_RDI[1]._vptr_ForceModifier = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ForceModifier + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ForceModifier + 2) = 0;
  in_RDI[1].info_ = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x36436f);
  Vector3<double>::Vector3((Vector3<double> *)0x36437f);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x364394);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3643aa);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3643c2);
  this_00 = SimInfo::getSimParams(in_RDI[1].info_);
  pLVar1 = Globals::getLightParameters(this_00);
  in_RDI[2]._vptr_ForceModifier = (_func_int **)pLVar1;
  return;
}

Assistant:

Light::Light(SimInfo* info) :
      ForceModifier {info}, initialized {false}, doLight {false},
      doParticlePot {false}, info_(info) {
    lightParams = info_->getSimParams()->getLightParameters();
  }